

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O0

void anon_unknown.dwarf_181bf::reduceY
               (ChannelList *channels,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *doNotFilter,Extrapolation ext,bool odd,Image *image0,Image *image1)

{
  int iVar1;
  bool bVar2;
  byte in_CL;
  Image *in_R9;
  bool filter;
  Channel *channel;
  char *name;
  ConstIterator i;
  TypedImageChannel<unsigned_int> *in_stack_fffffffffffffd88;
  Image *in_stack_fffffffffffffd90;
  allocator<char> *in_stack_fffffffffffffdc0;
  TypedImageChannel<float> *in_stack_fffffffffffffdc8;
  Image *in_stack_fffffffffffffdd0;
  TypedImageChannel<Imath_3_2::half> *in_stack_fffffffffffffdd8;
  TypedImageChannel<Imath_3_2::half> *in_stack_fffffffffffffde0;
  allocator<char> local_181;
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [39];
  undefined1 local_131 [40];
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [32];
  _Self local_98 [3];
  allocator<char> local_79;
  string local_78 [32];
  _Self local_58;
  undefined1 local_49;
  Channel *local_48;
  TypedImageChannel<Imath_3_2::half> *local_40;
  undefined8 local_38;
  undefined8 local_30;
  Image *local_28;
  byte local_15;
  
  local_15 = in_CL & 1;
  local_28 = in_R9;
  local_30 = Imf_3_4::ChannelList::begin();
  while( true ) {
    local_38 = Imf_3_4::ChannelList::end();
    bVar2 = Imf_3_4::operator!=((ConstIterator *)in_stack_fffffffffffffd90,
                                (ConstIterator *)in_stack_fffffffffffffd88);
    if (!bVar2) break;
    local_40 = (TypedImageChannel<Imath_3_2::half> *)
               Imf_3_4::ChannelList::ConstIterator::name((ConstIterator *)0x10d436);
    local_48 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x10d44b);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0
              );
    local_58._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffd88,(key_type *)0x10d4bc);
    local_98[0]._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffd88);
    bVar2 = std::operator==(&local_58,local_98);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator(&local_79);
    iVar1 = *(int *)local_48;
    local_49 = bVar2;
    if (iVar1 == 0) {
      in_stack_fffffffffffffdc0 = &local_159;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8,
                 in_stack_fffffffffffffdc0);
      Image::typedChannel<unsigned_int>
                (in_stack_fffffffffffffd90,(string *)in_stack_fffffffffffffd88);
      in_stack_fffffffffffffd90 = local_28;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8,
                 in_stack_fffffffffffffdc0);
      in_stack_fffffffffffffd88 =
           Image::typedChannel<unsigned_int>
                     (in_stack_fffffffffffffd90,(string *)in_stack_fffffffffffffd88);
      reduceY<unsigned_int>
                ((TypedImageChannel<unsigned_int> *)in_stack_fffffffffffffde0,
                 (TypedImageChannel<unsigned_int> *)in_stack_fffffffffffffdd8,
                 SUB81((ulong)in_stack_fffffffffffffdd0 >> 0x38,0),
                 (Extrapolation)in_stack_fffffffffffffdd0,
                 SUB81((ulong)in_stack_fffffffffffffdc8 >> 0x38,0));
      std::__cxx11::string::~string(local_180);
      std::allocator<char>::~allocator(&local_181);
      std::__cxx11::string::~string(local_158);
      std::allocator<char>::~allocator(&local_159);
    }
    else if (iVar1 == 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8,
                 in_stack_fffffffffffffdc0);
      Image::typedChannel<Imath_3_2::half>
                (in_stack_fffffffffffffd90,(string *)in_stack_fffffffffffffd88);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8,
                 in_stack_fffffffffffffdc0);
      Image::typedChannel<Imath_3_2::half>
                (in_stack_fffffffffffffd90,(string *)in_stack_fffffffffffffd88);
      reduceY<Imath_3_2::half>
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 SUB81((ulong)in_stack_fffffffffffffdd0 >> 0x38,0),
                 (Extrapolation)in_stack_fffffffffffffdd0,
                 SUB81((ulong)in_stack_fffffffffffffdc8 >> 0x38,0));
      std::__cxx11::string::~string(local_e0);
      std::allocator<char>::~allocator(&local_e1);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator(&local_b9);
    }
    else if (iVar1 == 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8,
                 in_stack_fffffffffffffdc0);
      Image::typedChannel<float>(in_stack_fffffffffffffd90,(string *)in_stack_fffffffffffffd88);
      in_stack_fffffffffffffde0 = (TypedImageChannel<Imath_3_2::half> *)local_131;
      in_stack_fffffffffffffdd0 = local_28;
      in_stack_fffffffffffffdd8 = local_40;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8,
                 in_stack_fffffffffffffdc0);
      in_stack_fffffffffffffdc8 =
           Image::typedChannel<float>(in_stack_fffffffffffffd90,(string *)in_stack_fffffffffffffd88)
      ;
      reduceY<float>((TypedImageChannel<float> *)in_stack_fffffffffffffde0,
                     (TypedImageChannel<float> *)in_stack_fffffffffffffdd8,
                     SUB81((ulong)in_stack_fffffffffffffdd0 >> 0x38,0),
                     (Extrapolation)in_stack_fffffffffffffdd0,
                     SUB81((ulong)in_stack_fffffffffffffdc8 >> 0x38,0));
      std::__cxx11::string::~string((string *)(local_131 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_131);
      std::__cxx11::string::~string(local_108);
      std::allocator<char>::~allocator(&local_109);
    }
    Imf_3_4::ChannelList::ConstIterator::operator++((ConstIterator *)in_stack_fffffffffffffd90);
  }
  return;
}

Assistant:

void
reduceY (
    const ChannelList& channels,
    const set<string>& doNotFilter,
    Extrapolation      ext,
    bool               odd,
    const Image&       image0,
    Image&             image1)
{
    //
    // Shrink image image0 vertically by a factor of 2,
    // and store the result in image image1.
    //

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        const char*    name    = i.name ();
        const Channel& channel = i.channel ();
        bool           filter = (doNotFilter.find (name) == doNotFilter.end ());

        switch (channel.type)
        {
            case IMF::HALF:

                reduceY (
                    image0.typedChannel<half> (name),
                    image1.typedChannel<half> (name),
                    filter,
                    ext,
                    odd);
                break;

            case IMF::FLOAT:

                reduceY (
                    image0.typedChannel<float> (name),
                    image1.typedChannel<float> (name),
                    filter,
                    ext,
                    odd);
                break;

            case IMF::UINT:

                reduceY (
                    image0.typedChannel<unsigned int> (name),
                    image1.typedChannel<unsigned int> (name),
                    filter,
                    ext,
                    odd);
                break;
            default: break;
        }
    }
}